

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_object.cpp
# Opt level: O0

void __thiscall JsonObject_MisplacedComma_Test::TestBody(JsonObject_MisplacedComma_Test *this)

{
  bool bVar1;
  parser<pstore::json::null_output> *ppVar2;
  error_code *peVar3;
  char *pcVar4;
  error_code eVar5;
  AssertHelper local_380;
  Message local_378;
  coord local_370;
  coord local_368;
  undefined1 local_360 [8];
  AssertionResult gtest_ar_5;
  Message local_348;
  error_code local_340;
  undefined1 local_330 [8];
  AssertionResult gtest_ar_4;
  undefined1 local_2f8 [8];
  parser<pstore::json::null_output> p3;
  Message local_258;
  coord local_250;
  coord local_248;
  undefined1 local_240 [8];
  AssertionResult gtest_ar_3;
  Message local_228;
  error_code local_220;
  undefined1 local_210 [8];
  AssertionResult gtest_ar_2;
  undefined1 local_1d8 [8];
  parser<pstore::json::null_output> p2;
  Message local_138;
  coord local_130;
  coord local_128;
  undefined1 local_120 [8];
  AssertionResult gtest_ar_1;
  Message local_108;
  error_code local_100;
  undefined1 local_f0 [8];
  AssertionResult gtest_ar;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  undefined1 local_a8 [8];
  parser<pstore::json::null_output> p1;
  JsonObject_MisplacedComma_Test *this_local;
  
  p1.coordinate_ = (coord)this;
  pstore::json::parser<pstore::json::null_output>::parser
            ((parser<pstore::json::null_output> *)local_a8,0);
  s_abi_cxx11_(&local_d0,"{\"a\":1,}",8);
  ppVar2 = pstore::json::parser<pstore::json::null_output>::input
                     ((parser<pstore::json::null_output> *)local_a8,&local_d0);
  pstore::json::parser<pstore::json::null_output>::eof(ppVar2);
  std::__cxx11::string::~string((string *)&local_d0);
  peVar3 = pstore::json::parser<pstore::json::null_output>::last_error
                     ((parser<pstore::json::null_output> *)local_a8);
  eVar5 = pstore::json::make_error_code(expected_token);
  local_100._M_cat = eVar5._M_cat;
  local_100._M_value = eVar5._M_value;
  testing::internal::EqHelper::Compare<std::error_code,_std::error_code,_nullptr>
            ((EqHelper *)local_f0,"p1.last_error ()",
             "make_error_code (json::error_code::expected_token)",peVar3,&local_100);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f0);
  if (!bVar1) {
    testing::Message::Message(&local_108);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_f0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_object.cpp"
               ,0x90,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_108);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_108);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f0);
  local_128 = pstore::json::parser<pstore::json::null_output>::coordinate
                        ((parser<pstore::json::null_output> *)local_a8);
  pstore::json::coord::coord(&local_130,8,1);
  testing::internal::EqHelper::Compare<pstore::json::coord,_pstore::json::coord,_nullptr>
            ((EqHelper *)local_120,"p1.coordinate ()","(json::coord{8U, 1U})",&local_128,&local_130)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_120);
  if (!bVar1) {
    testing::Message::Message(&local_138);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_120);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&p2.coordinate_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_object.cpp"
               ,0x91,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&p2.coordinate_,&local_138);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&p2.coordinate_);
    testing::Message::~Message(&local_138);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_120);
  pstore::json::parser<pstore::json::null_output>::~parser
            ((parser<pstore::json::null_output> *)local_a8);
  pstore::json::parser<pstore::json::null_output>::parser
            ((parser<pstore::json::null_output> *)local_1d8,0);
  s_abi_cxx11_((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &gtest_ar_2.message_,"{\"a\":1 \"b\":1}",0xd);
  ppVar2 = pstore::json::parser<pstore::json::null_output>::input
                     ((parser<pstore::json::null_output> *)local_1d8,(string *)&gtest_ar_2.message_)
  ;
  pstore::json::parser<pstore::json::null_output>::eof(ppVar2);
  std::__cxx11::string::~string((string *)&gtest_ar_2.message_);
  peVar3 = pstore::json::parser<pstore::json::null_output>::last_error
                     ((parser<pstore::json::null_output> *)local_1d8);
  eVar5 = pstore::json::make_error_code(expected_object_member);
  local_220._M_cat = eVar5._M_cat;
  local_220._M_value = eVar5._M_value;
  testing::internal::EqHelper::Compare<std::error_code,_std::error_code,_nullptr>
            ((EqHelper *)local_210,"p2.last_error ()",
             "make_error_code (json::error_code::expected_object_member)",peVar3,&local_220);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_210);
  if (!bVar1) {
    testing::Message::Message(&local_228);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_210);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_object.cpp"
               ,0x96,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_228);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_228);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_210);
  local_248 = pstore::json::parser<pstore::json::null_output>::coordinate
                        ((parser<pstore::json::null_output> *)local_1d8);
  pstore::json::coord::coord(&local_250,8,1);
  testing::internal::EqHelper::Compare<pstore::json::coord,_pstore::json::coord,_nullptr>
            ((EqHelper *)local_240,"p2.coordinate ()","(json::coord{8U, 1U})",&local_248,&local_250)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_240);
  if (!bVar1) {
    testing::Message::Message(&local_258);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_240);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&p3.coordinate_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_object.cpp"
               ,0x97,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&p3.coordinate_,&local_258);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&p3.coordinate_);
    testing::Message::~Message(&local_258);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_240);
  pstore::json::parser<pstore::json::null_output>::~parser
            ((parser<pstore::json::null_output> *)local_1d8);
  pstore::json::parser<pstore::json::null_output>::parser
            ((parser<pstore::json::null_output> *)local_2f8,0);
  s_abi_cxx11_((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &gtest_ar_4.message_,"{\"a\":1,,\"b\":1}",0xe);
  ppVar2 = pstore::json::parser<pstore::json::null_output>::input
                     ((parser<pstore::json::null_output> *)local_2f8,(string *)&gtest_ar_4.message_)
  ;
  pstore::json::parser<pstore::json::null_output>::eof(ppVar2);
  std::__cxx11::string::~string((string *)&gtest_ar_4.message_);
  peVar3 = pstore::json::parser<pstore::json::null_output>::last_error
                     ((parser<pstore::json::null_output> *)local_2f8);
  eVar5 = pstore::json::make_error_code(expected_token);
  local_340._M_cat = eVar5._M_cat;
  local_340._M_value = eVar5._M_value;
  testing::internal::EqHelper::Compare<std::error_code,_std::error_code,_nullptr>
            ((EqHelper *)local_330,"p3.last_error ()",
             "make_error_code (json::error_code::expected_token)",peVar3,&local_340);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_330);
  if (!bVar1) {
    testing::Message::Message(&local_348);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_330);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_object.cpp"
               ,0x9c,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_348);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_348);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_330);
  local_368 = pstore::json::parser<pstore::json::null_output>::coordinate
                        ((parser<pstore::json::null_output> *)local_2f8);
  pstore::json::coord::coord(&local_370,8,1);
  testing::internal::EqHelper::Compare<pstore::json::coord,_pstore::json::coord,_nullptr>
            ((EqHelper *)local_360,"p3.coordinate ()","(json::coord{8U, 1U})",&local_368,&local_370)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_360);
  if (!bVar1) {
    testing::Message::Message(&local_378);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_360);
    testing::internal::AssertHelper::AssertHelper
              (&local_380,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_object.cpp"
               ,0x9d,pcVar4);
    testing::internal::AssertHelper::operator=(&local_380,&local_378);
    testing::internal::AssertHelper::~AssertHelper(&local_380);
    testing::Message::~Message(&local_378);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_360);
  pstore::json::parser<pstore::json::null_output>::~parser
            ((parser<pstore::json::null_output> *)local_2f8);
  return;
}

Assistant:

TEST_F (JsonObject, MisplacedComma) {
    {
        // An object with a trailing comma but with the extension disabled.
        json::parser<json::null_output> p1;
        p1.input (R"({"a":1,})"s).eof ();
        EXPECT_EQ (p1.last_error (), make_error_code (json::error_code::expected_token));
        EXPECT_EQ (p1.coordinate (), (json::coord{8U, 1U}));
    }
    {
        json::parser<json::null_output> p2;
        p2.input (R"({"a":1 "b":1})"s).eof ();
        EXPECT_EQ (p2.last_error (), make_error_code (json::error_code::expected_object_member));
        EXPECT_EQ (p2.coordinate (), (json::coord{8U, 1U}));
    }
    {
        json::parser<json::null_output> p3;
        p3.input (R"({"a":1,,"b":1})"s).eof ();
        EXPECT_EQ (p3.last_error (), make_error_code (json::error_code::expected_token));
        EXPECT_EQ (p3.coordinate (), (json::coord{8U, 1U}));
    }
}